

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O0

void __thiscall wasm::BinaryInstWriter::visitDataDrop(BinaryInstWriter *this,DataDrop *curr)

{
  BufferWithRandomAccess *pBVar1;
  uint32_t value;
  U32LEB local_20;
  U32LEB local_1c;
  DataDrop *local_18;
  DataDrop *curr_local;
  BinaryInstWriter *this_local;
  
  local_18 = curr;
  curr_local = (DataDrop *)this;
  BufferWithRandomAccess::operator<<(this->o,-4);
  pBVar1 = this->o;
  LEB<unsigned_int,_unsigned_char>::LEB(&local_1c,9);
  BufferWithRandomAccess::operator<<(pBVar1,local_1c);
  pBVar1 = this->o;
  value = WasmBinaryWriter::getDataSegmentIndex
                    (this->parent,(Name)(local_18->segment).super_IString.str);
  LEB<unsigned_int,_unsigned_char>::LEB(&local_20,value);
  BufferWithRandomAccess::operator<<(pBVar1,local_20);
  return;
}

Assistant:

void BinaryInstWriter::visitDataDrop(DataDrop* curr) {
  o << int8_t(BinaryConsts::MiscPrefix);
  o << U32LEB(BinaryConsts::DataDrop);
  o << U32LEB(parent.getDataSegmentIndex(curr->segment));
}